

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  double dVar4;
  double beta;
  double alpha;
  delim_c local_3b;
  delim_c local_3a;
  delim_c local_39;
  result_type_conflict2 local_38;
  result_type_conflict2 local_30;
  double local_28;
  double local_20;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_39.c = '(';
  pbVar2 = utility::operator>>(in,&local_39);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_3a.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3a);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_3b.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3b);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    local_30 = local_20;
    local_38 = local_28;
    dVar4 = math::detail::Beta<double>(local_20,local_28);
    P->alpha_ = local_30;
    P->beta_ = local_38;
    P->norm_ = dVar4;
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t alpha, beta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> alpha >> utility::delim(' ') >> beta >>
            utility::delim(')');
        if (in)
          P = param_type(alpha, beta);
        in.flags(flags);
        return in;
      }